

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_hotspot.cxx
# Opt level: O2

void __thiscall Fl_Window::hotspot(Fl_Window *this,int X,int Y,int offscreen)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int Y_00;
  int iVar5;
  int X_00;
  int scr_y;
  int scr_h;
  int scr_w;
  int scr_x;
  int my;
  int mx;
  
  Fl::get_mouse(&mx,&my);
  X_00 = mx - X;
  Y_00 = my - Y;
  if (offscreen == 0) {
    Fl::screen_work_area(&scr_x,&scr_y,&scr_w,&scr_h);
    uVar3 = (this->super_Fl_Group).super_Fl_Widget.flags_ & 8;
    iVar2 = 0x14;
    if (uVar3 != 0) {
      iVar2 = 0;
    }
    uVar4 = uVar3 >> 1 ^ 4;
    iVar5 = (this->super_Fl_Group).super_Fl_Widget.w_ + uVar4;
    iVar1 = (scr_w + scr_x) - iVar5;
    if (iVar5 + X_00 <= scr_w + scr_x) {
      iVar1 = X_00;
    }
    X_00 = uVar4 + scr_x;
    if (scr_x <= (int)(iVar1 - uVar4)) {
      X_00 = iVar1;
    }
    iVar5 = (uVar3 ^ 8) + (this->super_Fl_Group).super_Fl_Widget.h_;
    iVar1 = (scr_h + scr_y) - iVar5;
    if (iVar5 + Y_00 <= scr_h + scr_y) {
      iVar1 = Y_00;
    }
    Y_00 = iVar2 + scr_y;
    if (scr_y <= iVar1 - iVar2) {
      Y_00 = iVar1;
    }
    if (X_00 == (this->super_Fl_Group).super_Fl_Widget.x_) {
      (this->super_Fl_Group).super_Fl_Widget.x_ = X_00 + -1;
    }
  }
  Fl_Widget::position((Fl_Widget *)this,X_00,Y_00);
  return;
}

Assistant:

void Fl_Window::hotspot(int X, int Y, int offscreen) {
  int mx,my;

  // Update the screen position based on the mouse position.
  Fl::get_mouse(mx,my);
  X = mx-X; Y = my-Y;

  // If offscreen is 0 (the default), make sure that the window
  // stays on the screen, if possible.
  if (!offscreen) {
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_work_area(scr_x, scr_y, scr_w, scr_h);

    int top = 0;
    int left = 0;
    int right = 0;
    int bottom = 0;

    if (border()) {
#ifdef WIN32
      if (size_range_set && (maxw != minw || maxh != minh)) {
        left = right = GetSystemMetrics(SM_CXSIZEFRAME);
        top = bottom = GetSystemMetrics(SM_CYSIZEFRAME);
      } else {
        left = right = GetSystemMetrics(SM_CXFIXEDFRAME); 
        top = bottom = GetSystemMetrics(SM_CYFIXEDFRAME);
      }
      top += GetSystemMetrics(SM_CYCAPTION);
#elif defined(__APPLE__)
      top = 24;
      left = 2;
      right = 2;
      bottom = 2;
#else
      // Ensure border is on screen; these values are generic enough
      // to work with many window managers, and are based on KDE defaults.
      top = 20;
      left = 4;
      right = 4;
      bottom = 8;
#endif
    }
    // now insure contents are on-screen (more important than border):
    if (X+w()+right > scr_w+scr_x) X = scr_w+scr_x-right-w();
    if (X-left < scr_x) X = left + scr_x;
    if (Y+h()+bottom > scr_h+scr_y) Y = scr_h+scr_y-bottom-h();
    if (Y-top < scr_y) Y = top + scr_y;
    // make sure that we will force this position
    if (X==x()) x(X-1);
  }

  position(X,Y);
}